

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::
BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::BinaryViewExpression
          (BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
           *this,ViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int> *e1,
          ViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int> *e2)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *this_00;
  ulong dimension;
  
  this->e1_ = (expression_type_1 *)e1;
  this->e2_ = (expression_type_2 *)e2;
  if ((*(long *)(e1 + 0x30) == 0) || (*(long *)(e2 + 0x30) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)e1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)e2 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)(e1 + 0x28) == *(long *)(e2 + 0x28)) {
    dimension = 0;
    do {
      if ((((View<int,_true,_std::allocator<unsigned_long>_> *)e1)->geometry_).dimension_ <=
          dimension) {
        return;
      }
      sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)e1,dimension);
      sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape(this->e2_,dimension);
      if (sVar1 != sVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_001f5b63;
      }
      dimension = dimension + 1;
      e1 = (ViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int> *)this->e1_
      ;
    } while (((View<int,_true,_std::allocator<unsigned_long>_> *)e1)->data_ != (pointer)0x0);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_001f5b63:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryViewExpression(const ViewExpression<E1, T1>& e1, 
        const ViewExpression<E2, T2>& e2) 
        : e1_(e1), e2_(e2), // cast!
          binaryFunctor_(BinaryFunctor()) 
        {
            if(!MARRAY_NO_DEBUG) {
                marray_detail::Assert(e1_.size() != 0 && e2_.size() != 0);
                marray_detail::Assert(e1_.dimension() == e2_.dimension());
                for(std::size_t j=0; j<e1_.dimension(); ++j) {
                    marray_detail::Assert(e1_.shape(j) == e2_.shape(j));
                }
            }
        }